

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O1

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteSingular<google::protobuf::json_internal::UnparseProto2Descriptor>
          (anon_unknown_4 *this,JsonWriter *writer,
          Field<google::protobuf::json_internal::UnparseProto2Descriptor> field)

{
  int32_t value;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 aVar1;
  string_view str;
  bool bVar2;
  EnumValueDescriptor *pEVar3;
  long lVar4;
  undefined8 uVar5;
  char *bytes;
  anon_union_8_2_3066aaf9_for_type_descriptor_ *this_00;
  double dVar6;
  undefined1 auVar7 [16];
  string_view str_00;
  Metadata MVar8;
  StatusOr<long> x;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> x_5;
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_d8;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_d0;
  pointer local_c8 [4];
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_a8;
  FeatureSet *local_a0;
  undefined1 local_98 [48];
  undefined1 local_68 [24];
  double dStack_50;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_40;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_38;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3 local_30;
  pointer local_28;
  
  this_00 = &local_d8;
  switch(field->type_) {
  case '\x01':
    local_d0 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
               (field->field_22).default_value_double_;
    local_d8 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x1;
    *(undefined8 *)this = 1;
    if (((writer->options_).allow_legacy_syntax != false) &&
       (0x7fefffffffffffff < (ulong)ABS((double)local_d0.data_))) {
      local_d0.data_ = (Message *)0x0;
    }
    JsonWriter::Write(writer,(double)local_d0);
    absl::lts_20240722::internal_statusor::StatusOrData<double>::~StatusOrData
              ((StatusOrData<double> *)&local_d8);
    break;
  case '\x02':
    local_d0._0_4_ = (field->field_22).default_value_uint32_t_;
    local_d8 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x1;
    *(undefined8 *)this = 1;
    if (((writer->options_).allow_legacy_syntax != false) &&
       (0x7f7fffff < (local_d0._0_4_ & 0x7fffffff))) {
      local_d0.data_ = (Message *)((ulong)(uint)local_d0._4_4_ << 0x20);
    }
    JsonWriter::Write(writer,(float)local_d0._0_4_);
    absl::lts_20240722::internal_statusor::StatusOrData<float>::~StatusOrData
              ((StatusOrData<float> *)&local_d8);
    break;
  case '\x03':
  case '\x10':
  case '\x12':
    local_d0 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
               (field->field_22).default_value_int64_t_;
    local_d8 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x1;
    *(undefined8 *)this = 1;
    if (((writer->options_).unquote_int64_if_possible == false) ||
       (bVar2 = RoundTripsThroughDouble<long>((long)local_d0), !bVar2)) {
      if (local_d8.message_type != (Descriptor *)0x1) goto LAB_002d558a;
      local_38 = local_d0;
      JsonWriter::Write<long>(writer,(Quoted<long> *)&local_38);
    }
    else {
      if (local_d8.message_type != (Descriptor *)0x1) {
LAB_002d558a:
        absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_d8);
LAB_002d5592:
        absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_d8);
        absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_d8);
        absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_d8);
LAB_002d55aa:
        absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_d8);
        absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_a8);
        uVar5 = absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_a8);
        if (local_d8.message_type != (Descriptor *)local_c8) {
          operator_delete(local_d8.message_type,(ulong)(local_c8[0] + 1));
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                  ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_a8
                  );
        _Unwind_Resume(uVar5);
      }
      JsonWriter::Write(writer,(int64_t)local_d0);
    }
    absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
              ((StatusOrData<long> *)&local_d8);
    break;
  case '\x04':
  case '\x06':
    aVar1 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
            (field->field_22).default_value_uint64_t_;
    local_d8 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x1;
    *(undefined8 *)this = 1;
    local_d0 = aVar1;
    if ((writer->options_).unquote_int64_if_possible == false) {
LAB_002d5295:
      if (local_d8.message_type != (Descriptor *)0x1) goto LAB_002d5592;
      local_40.data_ = (Message *)local_d0;
      JsonWriter::Write<unsigned_long>(writer,(Quoted<unsigned_long> *)&local_40);
    }
    else {
      auVar7._8_4_ = aVar1._4_4_;
      auVar7._0_8_ = aVar1.data_;
      auVar7._12_4_ = 0x45300000;
      dStack_50 = auVar7._8_8_ - 1.9342813113834067e+25;
      local_68._16_8_ = dStack_50 + ((double)CONCAT44(0x43300000,aVar1._0_4_) - 4503599627370496.0);
      dVar6 = ldexp(1.0,0x40);
      if (aVar1.data_ !=
          (Message *)
          ((long)((double)local_68._16_8_ - 9.223372036854776e+18) &
           (long)(double)local_68._16_8_ >> 0x3f | (long)(double)local_68._16_8_) ||
          dVar6 <= (double)local_68._16_8_) goto LAB_002d5295;
      if (local_d8.message_type != (Descriptor *)0x1) goto LAB_002d5592;
      JsonWriter::Write(writer,(uint64_t)local_d0);
    }
    absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
              ((StatusOrData<unsigned_long> *)&local_d8);
    break;
  case '\x05':
  case '\x0f':
  case '\x11':
    local_d0._0_4_ = (field->field_22).default_value_int32_t_;
    local_d8 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x1;
    *(undefined8 *)this = 1;
    JsonWriter::Write(writer,local_d0._0_4_);
    goto LAB_002d5492;
  case '\a':
  case '\r':
    local_d0._0_4_ = (field->field_22).default_value_uint32_t_;
    local_d8 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x1;
    *(undefined8 *)this = 1;
    JsonWriter::Write(writer,local_d0._0_4_);
    absl::lts_20240722::internal_statusor::StatusOrData<unsigned_int>::~StatusOrData
              ((StatusOrData<unsigned_int> *)&local_d8);
    break;
  case '\b':
    bVar2 = (field->field_22).default_value_bool_;
    local_d0._0_1_ = bVar2;
    local_d8 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x1;
    *(undefined8 *)this = 1;
    bytes = "false";
    if ((ulong)bVar2 != 0) {
      bytes = "true";
    }
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,bytes,(ulong)bVar2 ^ 5);
    absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
              ((StatusOrData<bool> *)&local_d8);
    break;
  case '\t':
    local_c8[0] = (((field->field_22).default_value_string_)->_M_dataplus)._M_p;
    local_d0 = (anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::Message_*>_3)
               ((field->field_22).default_value_string_)->_M_string_length;
    local_d8 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x1;
    *(undefined8 *)this = 1;
    local_30 = local_d0;
    local_28 = local_c8[0];
    JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
              (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_30);
    goto LAB_002d556c;
  case '\n':
  case '\v':
    UnparseProto2Descriptor::GetMessage((Field)&local_d8);
    *(anon_union_8_2_3066aaf9_for_type_descriptor_ *)this = local_d8;
    if (((ulong)local_d8.message_type & 1) == 0) {
      LOCK();
      *(int *)local_d8.message_type = *(int *)local_d8.message_type + 1;
      UNLOCK();
    }
    if (*(long *)this != 1) {
LAB_002d525f:
      absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
      ~StatusOrData((StatusOrData<const_google::protobuf::Message_*> *)&local_d8);
      return (Status)this;
    }
    if (local_d8.message_type == (Descriptor *)0x1) {
      MVar8 = Message::GetMetadata(local_d0.data_);
      WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
                (this,writer,local_d0.data_,MVar8.descriptor,false);
      goto LAB_002d525f;
    }
    goto LAB_002d55aa;
  case '\f':
    local_98._0_8_ = (((field->field_22).default_value_string_)->_M_dataplus)._M_p;
    local_a0 = (FeatureSet *)((field->field_22).default_value_string_)->_M_string_length;
    local_a8 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x1;
    *(undefined8 *)this = 1;
    if ((writer->options_).allow_legacy_syntax == false) {
      str._M_str = (char *)local_98._0_8_;
      str._M_len = (size_t)local_a0;
      JsonWriter::WriteBase64(writer,str);
    }
    else {
      absl::lts_20240722::CEscape_abi_cxx11_(&local_d8,local_a0,local_98._0_8_);
      str_00._M_str = (char *)local_d8.message_type;
      str_00._M_len = (size_t)local_d0.data_;
      JsonWriter::WriteBase64(writer,str_00);
      if (local_d8.message_type != (Descriptor *)local_c8) {
        operator_delete(local_d8.message_type,(ulong)(local_c8[0] + 1));
      }
    }
    this_00 = &local_a8;
LAB_002d556c:
    absl::lts_20240722::internal_statusor::
    StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
              ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)this_00);
    break;
  case '\x0e':
    pEVar3 = FieldDescriptor::default_value_enum(field);
    value = pEVar3->number_;
    local_d0._0_4_ = value;
    local_d8 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x1;
    *(undefined8 *)this = 1;
    WriteEnum<google::protobuf::json_internal::UnparseProto2Descriptor>
              (writer,field,value,kUnquoted);
LAB_002d5492:
    absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
              ((StatusOrData<int> *)&local_d8);
    break;
  default:
    local_d8 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x18;
    local_d0.data_ = (Message *)0x3eb1db;
    lVar4 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                      ((uint)field->type_,(char *)local_98);
    local_a8.message_type = (Descriptor *)(lVar4 - (long)local_98);
    local_a0 = (FeatureSet *)local_98;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)(local_98 + 0x20),(AlphaNum *)&local_d8);
    absl::lts_20240722::InvalidArgumentError(this,local_98._40_8_,local_98._32_8_);
    if ((KeyValue *)local_98._32_8_ == (KeyValue *)local_68) {
      return (Status)this;
    }
    operator_delete((void *)local_98._32_8_,(ulong)(local_68._0_8_ + 1));
    return (Status)this;
  }
  *(undefined8 *)this = 1;
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteSingular(JsonWriter& writer, Field<Traits> field,
                           Args&&... args) {
  // When the pack `args` is empty, the caller has requested printing the
  // default value.
  bool is_default = sizeof...(Args) == 0;
  switch (Traits::FieldType(field)) {
    case FieldDescriptor::TYPE_FLOAT: {
      auto x = Traits::GetFloat(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().allow_legacy_syntax && is_default &&
          !std::isfinite(*x)) {
        *x = 0;
      }
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_DOUBLE: {
      auto x = Traits::GetDouble(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().allow_legacy_syntax && is_default &&
          !std::isfinite(*x)) {
        *x = 0;
      }
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_SFIXED64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_INT64: {
      auto x = Traits::GetInt64(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().unquote_int64_if_possible &&
          RoundTripsThroughDouble(*x)) {
        writer.Write(*x);
      } else {
        writer.Write(MakeQuoted(*x));
      }
      break;
    }
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_UINT64: {
      auto x = Traits::GetUInt64(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().unquote_int64_if_possible &&
          RoundTripsThroughDouble(*x)) {
        writer.Write(*x);
      } else {
        writer.Write(MakeQuoted(*x));
      }
      break;
    }
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_INT32: {
      auto x = Traits::GetInt32(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_UINT32: {
      auto x = Traits::GetUInt32(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_BOOL: {
      auto x = Traits::GetBool(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(*x ? "true" : "false");
      break;
    }
    case FieldDescriptor::TYPE_STRING: {
      auto x = Traits::GetString(field, writer.ScratchBuf(),
                                 std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(MakeQuoted(*x));
      break;
    }
    case FieldDescriptor::TYPE_BYTES: {
      auto x = Traits::GetString(field, writer.ScratchBuf(),
                                 std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().allow_legacy_syntax && is_default) {
        // Although difficult to verify, it appears that the original ESF parser
        // fails to unescape the contents of a
        // google.protobuf.Field.default_value, which may potentially be
        // escaped if it is for a `bytes` field (note that default_value is a
        // `string` regardless of what type the field is).
        //
        // However, our parser's type.proto guts actually know to do this
        // correctly, so this bug must be manually re-introduced.
        writer.WriteBase64(absl::CEscape(*x));
      } else {
        writer.WriteBase64(*x);
      }
      break;
    }
    case FieldDescriptor::TYPE_ENUM: {
      auto x = Traits::GetEnumValue(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      WriteEnum<Traits>(writer, field, *x);
      break;
    }
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP: {
      auto x = Traits::GetMessage(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      return WriteMessage<Traits>(writer, **x, Traits::GetDesc(**x));
    }
    default:
      return absl::InvalidArgumentError(
          absl::StrCat("unsupported field type: ", Traits::FieldType(field)));
  }

  return absl::OkStatus();
}